

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::
int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::on_num
          (int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_> *this)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  basic_format_specs<char> *pbVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  _Alloc_hider _Var8;
  char *pcVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  undefined1 auVar14 [16];
  string groups;
  format_specs local_108;
  ulong local_e8;
  basic_format_specs<char> *local_e0;
  string local_d8;
  ulong local_b8;
  ulong uStack_b0;
  undefined4 local_a8;
  padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::int_writer<__int128,_duckdb_fmt::v6::basic_format_specs<char>_>::num_writer>
  local_98;
  
  grouping_impl<char>(&local_d8,(locale_ref)(this->writer->locale_).locale_);
  if (local_d8._M_string_length == 0) {
    on_dec(this);
  }
  else {
    pbVar4 = this->specs;
    cVar2 = pbVar4->thousands;
    if (cVar2 == '\0') {
      on_dec(this);
    }
    else {
      uVar5 = (ulong)this->abs_value;
      local_e8 = *(ulong *)((long)&this->abs_value + 8);
      auVar14 = (undefined1  [16])this->abs_value;
      uVar13 = 1;
      local_e0 = pbVar4;
      if ((uVar5 < 10) <= local_e8) {
        uVar6 = 4;
        do {
          uVar13 = uVar6;
          uVar7 = auVar14._8_8_;
          uVar12 = auVar14._0_8_;
          if (uVar7 == 0 && (ulong)(99 < uVar12) <= -uVar7) {
            uVar13 = uVar13 - 2;
            goto LAB_002a4c60;
          }
          if (uVar7 == 0 && (ulong)(999 < uVar12) <= -uVar7) {
            uVar13 = uVar13 - 1;
            goto LAB_002a4c60;
          }
          if (uVar7 < (uVar12 < 10000)) goto LAB_002a4c60;
          auVar14 = __udivti3(uVar12,uVar7,10000,0);
          uVar6 = uVar13 + 4;
        } while (uVar7 != 0 || -uVar7 < (ulong)(99999 < uVar12));
        uVar13 = uVar13 + 1;
      }
LAB_002a4c60:
      local_98.f.groups = &local_d8;
      pcVar1 = local_d8._M_dataplus._M_p + local_d8._M_string_length;
      uVar10 = (int)local_d8._M_string_length + uVar13;
      _Var8._M_p = local_d8._M_dataplus._M_p;
      uVar6 = uVar13;
      do {
        cVar3 = *_Var8._M_p;
        uVar11 = uVar6 - (int)cVar3;
        pcVar9 = _Var8._M_p;
        local_98.f.size = uVar13;
        if ((uVar11 == 0 || (int)uVar6 < (int)cVar3) || ((byte)(cVar3 + 0x81U) < 0x82)) break;
        uVar13 = uVar13 + 1;
        _Var8._M_p = _Var8._M_p + 1;
        local_d8._M_string_length = local_d8._M_string_length - 1;
        pcVar9 = pcVar1;
        local_98.f.size = uVar10;
        uVar6 = uVar11;
      } while (local_d8._M_string_length != 0);
      if (pcVar9 == pcVar1) {
        local_98.f.size = (int)(uVar6 - 1) / (int)pcVar1[-1] + local_98.f.size;
      }
      local_98.prefix.size_ = (size_t)this->prefix_size;
      local_108.thousands = local_e0->thousands;
      local_108._17_3_ = *(undefined3 *)&local_e0->field_0x11;
      local_108.width = local_e0->width;
      local_108.precision = local_e0->precision;
      uStack_b0._0_1_ = local_e0->type;
      uStack_b0._1_1_ = local_e0->field_0x9;
      uStack_b0._2_6_ = local_e0->fill;
      uVar7 = (uint)local_98.f.size + local_98.prefix.size_;
      local_108.fill.data_[0] = (char)uStack_b0._2_6_;
      local_98.size_ = uVar7;
      local_98.fill = local_108.fill.data_[0];
      if ((uStack_b0._1_1_ & 0xf) == 4) {
        uVar12 = local_108._0_8_ & 0xffffffff;
        local_98.padding = 0;
        if (uVar7 <= uVar12) {
          local_98.size_ = uVar12;
          local_98.padding = uVar12 - uVar7;
        }
      }
      else if (local_98.f.size < (int)local_108.precision) {
        local_98.size_ = (uint)local_108.precision + local_98.prefix.size_;
        local_98.padding = (ulong)(uint)(local_108.precision - local_98.f.size);
        local_98.fill = '0';
      }
      else {
        local_98.padding = 0;
      }
      local_98.prefix.data_ = this->prefix;
      local_108._8_8_ = uStack_b0;
      if ((uStack_b0 & 0xf00) == 0) {
        local_108._8_8_ = uStack_b0 | 0x200;
      }
      local_98.f.abs_value._8_8_ = local_e8;
      local_b8 = local_108._0_8_;
      local_a8 = local_108._16_4_;
      local_98.f.abs_value._0_8_ = uVar5;
      local_98.f.sep = cVar2;
      basic_writer<duckdb_fmt::v6::buffer_range<char>>::
      write_padded<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::padded_int_writer<duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>>::int_writer<__int128,duckdb_fmt::v6::basic_format_specs<char>>::num_writer>>
                ((basic_writer<duckdb_fmt::v6::buffer_range<char>> *)this->writer,&local_108,
                 &local_98);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void on_num() {
      std::string groups = grouping<char_type>(writer.locale_);
      if (groups.empty()) return on_dec();
      auto sep = specs.thousands;
      if (!sep) return on_dec();
      int num_digits = count_digits(abs_value);
      int size = num_digits;
      std::string::const_iterator group = groups.cbegin();
      while (group != groups.cend() && num_digits > *group && *group > 0 &&
             *group != max_value<char>()) {
        size += sep_size;
        num_digits -= *group;
        ++group;
      }
      if (group == groups.cend())
        size += sep_size * ((num_digits - 1) / groups.back());
      writer.write_int(size, get_prefix(), specs,
                       num_writer{abs_value, size, groups, static_cast<char_type>(sep)});
    }